

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O3

void base64_stream_encode_final(base64_state *state,char *out,size_t *outlen)

{
  size_t sVar1;
  uint8_t *o;
  char *pcVar2;
  
  if (state->bytes == 2) {
    *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[state->carry];
    pcVar2 = out + 1;
    sVar1 = 2;
  }
  else {
    if (state->bytes != 1) {
      sVar1 = 0;
      goto LAB_001026c1;
    }
    *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[state->carry];
    out[1] = '=';
    pcVar2 = out + 2;
    sVar1 = 3;
  }
  *pcVar2 = '=';
LAB_001026c1:
  *outlen = sVar1;
  return;
}

Assistant:

void
base64_stream_encode_final
	( struct base64_state	*state
	, char			*out
	, size_t		*outlen
	)
{
	uint8_t *o = (uint8_t *)out;

	if (state->bytes == 1) {
		*o++ = base64_table_enc_6bit[state->carry];
		*o++ = '=';
		*o++ = '=';
		*outlen = 3;
		return;
	}
	if (state->bytes == 2) {
		*o++ = base64_table_enc_6bit[state->carry];
		*o++ = '=';
		*outlen = 2;
		return;
	}
	*outlen = 0;
}